

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void __thiscall
FIX::double_conversion::StringBuilder::AddSubstring(StringBuilder *this,char *s,int n)

{
  int index;
  size_t sVar1;
  char *__dest;
  
  index = this->position_;
  if ((-1 < index) && (index + n < (this->buffer_).length_)) {
    sVar1 = strlen(s);
    if ((ulong)(long)n <= sVar1) {
      __dest = Vector<char>::operator[](&this->buffer_,index);
      memmove(__dest,s,(long)n);
      this->position_ = this->position_ + n;
      return;
    }
    __assert_fail("static_cast<size_t>(n) <= strlen(s)",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                  ,0x102,
                  "void FIX::double_conversion::StringBuilder::AddSubstring(const char *, int)");
  }
  __assert_fail("!is_finalized() && position_ + n < buffer_.length()",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                ,0x101,"void FIX::double_conversion::StringBuilder::AddSubstring(const char *, int)"
               );
}

Assistant:

void AddSubstring(const char* s, int n) {
    ASSERT(!is_finalized() && position_ + n < buffer_.length());
    ASSERT(static_cast<size_t>(n) <= strlen(s));
    memmove(&buffer_[position_], s, n * kCharSize);
    position_ += n;
  }